

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

void mxx::gather<std::pair<int,double>>
               (pair<int,_double> *data,size_t size,pair<int,_double> *out,int root,comm *comm)

{
  int iVar1;
  MPI_Datatype poVar2;
  MPI_Datatype poVar3;
  MPI_Comm poVar4;
  undefined1 local_48 [8];
  datatype dt;
  comm *comm_local;
  int root_local;
  pair<int,_double> *out_local;
  size_t size_local;
  pair<int,_double> *data_local;
  
  dt._16_8_ = comm;
  iVar1 = mxx::comm::size(comm);
  if (size * (long)iVar1 < 0x7fffffff) {
    get_datatype<std::pair<int,double>>();
    poVar2 = datatype::type((datatype *)local_48);
    poVar3 = datatype::type((datatype *)local_48);
    poVar4 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Gather(data,size & 0xffffffff,poVar2,out,size & 0xffffffff,poVar3,root,poVar4);
    datatype::~datatype((datatype *)local_48);
  }
  else {
    impl::gather_big<std::pair<int,double>>(data,size,out,root,(comm *)dt._16_8_);
  }
  return;
}

Assistant:

void gather(const T* data, size_t size, T* out, int root, const mxx::comm& comm = mxx::comm()) {
    if (size*comm.size() >= mxx::max_int) {
        // use custom implementation for big data
        impl::gather_big(data, size, out, root, comm);
    } else {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Gather(const_cast<T*>(data), size, dt.type(), out, size, dt.type(), root, comm);
    }
}